

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

QRect __thiscall QTableWidget::visualItemRect(QTableWidget *this,QTableWidgetItem *item)

{
  QTableModel *__s;
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QTableWidgetPrivate *d;
  QModelIndex index;
  QRect *in_stack_ffffffffffffffa0;
  undefined1 local_30 [16];
  QTableWidgetItem *local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QTableWidget *)0x8dc16f);
  if (in_RSI == 0) {
    QRect::QRect(in_stack_ffffffffffffffa0);
  }
  else {
    local_30._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = (QTableWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
    __s = QTableWidgetPrivate::tableModel((QTableWidgetPrivate *)0x8dc1b6);
    QTableModel::index((QTableModel *)local_30,(char *)__s,(int)in_RSI);
    local_18 = (**(code **)(*in_RDI + 0x1e0))(in_RDI,local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QRect)local_18;
  }
  __stack_chk_fail();
}

Assistant:

QRect QTableWidget::visualItemRect(const QTableWidgetItem *item) const
{
    Q_D(const QTableWidget);
    if (!item)
        return QRect();
    QModelIndex index = d->tableModel()->index(const_cast<QTableWidgetItem*>(item));
    Q_ASSERT(index.isValid());
    return visualRect(index);
}